

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void SimpleLoggerMgr::handleSegAbort(int sig)

{
  bool bVar1;
  SimpleLoggerMgr *pSVar2;
  SimpleLoggerMgr *unaff_retaddr;
  string *in_stack_00000010;
  int in_stack_0000001c;
  SimpleLoggerMgr *in_stack_00000020;
  SimpleLoggerMgr *mgr;
  size_t in_stack_000001a0;
  SimpleLoggerMgr *in_stack_000001a8;
  allocator local_31;
  string local_30 [24];
  SimpleLoggerMgr *in_stack_ffffffffffffffe8;
  
  pSVar2 = get();
  signal(6,(__sighandler_t)pSVar2->oldSigAbortHandler);
  enableOnlyOneDisplayer(unaff_retaddr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Abort",&local_31);
  flushAllLoggers(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  logStackBacktrace(in_stack_000001a8,in_stack_000001a0);
  printf("[ABORT] Flushed all logs safely.\n");
  fflush(_stdout);
  bVar1 = chkExitOnCrash(in_stack_ffffffffffffffe8);
  if (!bVar1) {
    abort();
  }
  printf("[ABORT] Exit on crash.\n");
  fflush(_stdout);
  exit(-1);
}

Assistant:

void SimpleLoggerMgr::handleSegAbort(int sig) {
#if defined(__linux__) || defined(__APPLE__)
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    signal(SIGABRT, mgr->oldSigAbortHandler);
    mgr->enableOnlyOneDisplayer();
    mgr->flushAllLoggers(1, "Abort");
    mgr->logStackBacktrace();

    printf("[ABORT] Flushed all logs safely.\n");
    fflush(stdout);

    if (mgr->chkExitOnCrash()) {
        printf("[ABORT] Exit on crash.\n");
        fflush(stdout);
        exit(-1);
    }

    abort();
#endif
}